

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O1

void __thiscall
chrono::utils::MixtureIngredient::calcGeometricProps
          (MixtureIngredient *this,ChVector<double> *size,double *volume,ChVector<double> *gyration)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  switch(this->m_type) {
  case SPHERE:
    dVar19 = size->m_data[0];
    *volume = dVar19 * dVar19 * dVar19 * 4.1887902047863905;
    dVar6 = size->m_data[0] * size->m_data[0] * 0.4;
    dVar19 = dVar6;
    dVar4 = dVar6;
    break;
  case ELLIPSOID:
    *volume = size->m_data[0] * 4.1887902047863905 * size->m_data[1] * size->m_data[2];
    dVar4 = size->m_data[0];
    dVar19 = size->m_data[1];
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar19;
    dVar5 = size->m_data[2];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar5 * dVar5;
    auVar1 = vfmadd231sd_fma(auVar12,auVar36,auVar36);
    dVar6 = auVar1._0_8_;
    dVar27 = 0.2;
    goto LAB_00943232;
  case BOX:
    *volume = size->m_data[0] * 8.0 * size->m_data[1] * size->m_data[2];
    dVar4 = size->m_data[0];
    dVar19 = size->m_data[1];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar19;
    dVar5 = size->m_data[2];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar5 * dVar5;
    auVar1 = vfmadd231sd_fma(auVar8,auVar33,auVar33);
    dVar6 = auVar1._0_8_;
    dVar27 = 0.3333333333333333;
LAB_00943232:
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar4;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar5;
    dVar6 = dVar6 * dVar27;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar4 * dVar4;
    auVar1 = vfmadd231sd_fma(auVar41,auVar21,auVar21);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar19 * dVar19;
    auVar9 = vfmadd231sd_fma(auVar37,auVar28,auVar28);
    dVar19 = auVar1._0_8_ * dVar27;
    dVar4 = auVar9._0_8_ * dVar27;
    break;
  case CYLINDER:
    *volume = size->m_data[0] * size->m_data[0] * 6.283185307179586 * size->m_data[1];
    dVar19 = size->m_data[0];
    dVar4 = size->m_data[1];
    goto LAB_009431c7;
  case CONE:
    *volume = (size->m_data[0] * size->m_data[0] * 3.141592653589793 * size->m_data[1]) / 3.0;
    dVar19 = size->m_data[0] * size->m_data[0];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar19 * 0.15;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = size->m_data[1] * size->m_data[1];
    auVar1 = vfmadd231sd_fma(auVar7,auVar20,ZEXT816(0x3fa3333333333333));
    dVar6 = auVar1._0_8_;
    dVar19 = dVar19 * 0.3;
    dVar4 = dVar6;
    break;
  case CAPSULE:
    dVar19 = size->m_data[0];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = size->m_data[1];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar19 * dVar19 * dVar19 * 0.6666666666666666;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar19 * dVar19;
    auVar1 = vfmadd231sd_fma(auVar13,auVar24,auVar2);
    *volume = auVar1._0_8_ * 6.283185307179586;
    dVar19 = size->m_data[0];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar19;
    dVar4 = size->m_data[1];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar4;
    dVar27 = (dVar4 * 1.5) / dVar19;
    auVar1 = vfmadd213sd_fma(ZEXT816(0x3fd8000000000000),auVar25,auVar14);
    dVar5 = dVar27 + 1.0;
    dVar27 = dVar27 / dVar5;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar19 * 3.0;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar4 * 4.0 * dVar4;
    auVar9 = vfmadd231sd_fma(auVar46,auVar25,auVar45);
    dVar5 = 1.0 / dVar5;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar19 * 0.259;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = auVar1._0_8_ * auVar1._0_8_;
    auVar1 = vfmadd231sd_fma(auVar38,auVar25,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = auVar1._0_8_ * dVar5;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar27 * 0.08333333333333333;
    auVar1 = vfmadd231sd_fma(auVar16,auVar43,auVar9);
    dVar6 = auVar1._0_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar19 * dVar19 * dVar5 * 0.4;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar27 * 0.5;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar19 * dVar19;
    auVar1 = vfmadd231sd_fma(auVar26,auVar39,auVar31);
    dVar19 = auVar1._0_8_;
    dVar4 = dVar6;
    break;
  case BISPHERE:
    dVar19 = size->m_data[0];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar19;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = size->m_data[1];
    auVar1 = vfmsub231sd_fma(auVar32,auVar17,ZEXT816(0x4000000000000000));
    auVar1 = vfmadd213sd_fma(auVar1,ZEXT816(0xbfe0000000000000),auVar17);
    *volume = dVar19 * dVar19 * dVar19 * 4.1887902047863905 * (auVar1._0_8_ / dVar19 + 1.0);
    dVar19 = size->m_data[0];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar19;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = size->m_data[1];
    auVar1 = vfmsub213sd_fma(ZEXT816(0x4000000000000000),auVar42,auVar3);
    auVar1 = vfmadd213sd_fma(auVar1,ZEXT816(0xbfe0000000000000),auVar42);
    dVar6 = auVar1._0_8_;
    auVar18._0_8_ = dVar6 / dVar19;
    auVar18._8_8_ = auVar1._8_8_;
    dVar4 = auVar18._0_8_ + 1.0;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = auVar18._0_8_ * auVar18._0_8_;
    auVar1 = vfnmadd213sd_fma(auVar44,auVar18,ZEXT816(0xbff0000000000000));
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar4;
    auVar1 = vfmadd132sd_fma(auVar1,auVar40,ZEXT816(0x3fd5555555555555));
    auVar9 = vfnmadd213sd_fma(auVar18,auVar18,ZEXT816(0x3ff0000000000000));
    if (auVar9._0_8_ < 0.0) {
      dVar5 = sqrt(auVar9._0_8_);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      dVar5 = auVar9._0_8_;
    }
    dVar6 = dVar5 * dVar19 * 0.5 * dVar6 +
            dVar6 * dVar6 * 0.6666666666666666 * dVar4 +
            (dVar19 * dVar19 * 0.4 * dVar4 - dVar19 * dVar19 * 0.2 * auVar1._0_8_);
    dVar6 = (dVar6 + dVar6) / (dVar4 * 1.3333333333333333);
    dVar19 = (dVar19 * dVar19 * 0.6 * auVar1._0_8_) / dVar4;
    dVar4 = dVar6;
    break;
  case ROUNDEDCYLINDER:
    dVar19 = size->m_data[0];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar19;
    dVar4 = size->m_data[2];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar4;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar4 * dVar4 * 0.6666666666666666;
    auVar9 = vfmadd231sd_fma(auVar34,auVar9,auVar9);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size->m_data[1];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = (dVar19 + dVar4) * (dVar19 + dVar4);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar4 * auVar9._0_8_;
    auVar1 = vfmadd231sd_fma(auVar35,auVar29,auVar1);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar19 * 0.5707963267948966 * dVar4;
    auVar1 = vfmadd213sd_fma(auVar10,auVar22,auVar1);
    *volume = auVar1._0_8_ * 6.283185307179586;
    dVar19 = size->m_data[2] + size->m_data[0];
    dVar4 = size->m_data[2] + size->m_data[1];
LAB_009431c7:
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar19;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar4 * dVar4 * 4.0;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar19 * 3.0;
    auVar1 = vfmadd231sd_fma(auVar11,auVar23,auVar30);
    dVar6 = auVar1._0_8_ * 0.08333333333333333;
    dVar19 = dVar19 * dVar19 * 0.5;
    dVar4 = dVar6;
    break;
  default:
    goto switchD_0094308b_default;
  }
  gyration->m_data[0] = dVar6;
  gyration->m_data[1] = dVar19;
  gyration->m_data[2] = dVar4;
switchD_0094308b_default:
  return;
}

Assistant:

void MixtureIngredient::calcGeometricProps(const ChVector<>& size, double& volume, ChVector<>& gyration) {
    switch (m_type) {
        case MixtureType::SPHERE:
            volume = CalcSphereVolume(size.x());
            gyration = CalcSphereGyration(size.x()).diagonal();
            break;
        case MixtureType::ELLIPSOID:
            volume = CalcEllipsoidVolume(size);
            gyration = CalcEllipsoidGyration(size).diagonal();
            break;
        case MixtureType::BOX:
            volume = CalcBoxVolume(size);
            gyration = CalcBoxGyration(size).diagonal();
            break;
        case MixtureType::CYLINDER:
            volume = CalcCylinderVolume(size.x(), size.y());
            gyration = CalcCylinderGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::CONE:
            volume = CalcConeVolume(size.x(), size.y());
            gyration = CalcConeGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::BISPHERE:
            volume = CalcBiSphereVolume(size.x(), size.y());
            gyration = CalcBiSphereGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::CAPSULE:
            volume = CalcCapsuleVolume(size.x(), size.y());
            gyration = CalcCapsuleGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::ROUNDEDCYLINDER:
            volume = CalcRoundedCylinderVolume(size.x(), size.y(), size.z());
            gyration = CalcRoundedCylinderGyration(size.x(), size.y(), size.z()).diagonal();
            break;
    }
}